

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O3

void optional_suite::test_value(void)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  oarchive ar;
  ostringstream result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  long *local_218 [2];
  long local_208 [2];
  undefined1 local_1f8 [48];
  type local_1c8;
  pointer local_1b0;
  pointer local_1a0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1f8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"alpha","");
  trial::protocol::json::basic_writer<char,16ul>::value<std::__cxx11::string_const&>
            ((basic_writer<char,16ul> *)(local_1f8 + 0x30),&local_238);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[8]>
            ("result.str()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x166,"void optional_suite::test_value()",local_218,"\"alpha\"");
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_1f8._0_8_ = &PTR_vsave_001248d0;
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0,(long)local_1a0 - (long)local_1b0);
  }
  (**(code **)local_1c8._0_8_)((basic_writer<char,16ul> *)(local_1f8 + 0x30));
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_1f8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void test_value()
{
    std::ostringstream result;
    json::oarchive ar(result);
    boost::optional<std::string> value("alpha");
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"alpha\"");
}